

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

object_class *
lsvm::object::new_class(package *pkg,symbol *name,object_class *super,uint16_t fields_count)

{
  int iVar1;
  object_class *poVar2;
  hashmap *phVar3;
  undefined6 in_register_0000000a;
  ulong __n;
  
  iVar1 = (int)CONCAT62(in_register_0000000a,fields_count);
  __n = (ulong)(uint)(iVar1 * 8);
  poVar2 = (object_class *)memory::allocate(__n + 0x28);
  poVar2->pkg = pkg;
  poVar2->name = name;
  poVar2->super = super;
  poVar2->fields_count = fields_count;
  phVar3 = hashmap::new_hashmap
                     (symbol::symbol_equals,symbol::symbol_hash,'\x01','\x03',3,100,7,0x2ac5);
  poVar2->methods = phVar3;
  if (iVar1 != 0) {
    memset(poVar2 + 1,0,__n);
  }
  return poVar2;
}

Assistant:

object_class* new_class(package* pkg, symbol* name, object_class* super, uint16_t fields_count){
    object_class* cls = (object_class*)lsvm::memory::allocate(sizeof(object_class)+(fields_count*sizeof(symbol*)));
    cls->pkg = pkg;
    cls->name = name;
    cls->super = super;
    cls->fields_count = fields_count;
    cls->methods = lsvm::symbol::new_symbolmap();

    for(uint16_t i = 0; i<fields_count; ++i){
        cls->fields[i] = null;
    }

    return cls;
}